

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_float.h
# Opt level: O2

void duckdb_fast_float::detail::decimal_left_shift(decimal *h,uint32_t shift)

{
  uint32_t uVar1;
  ulong uVar2;
  ulong uVar3;
  uint32_t uVar4;
  uint uVar5;
  uint32_t uVar6;
  
  if (h->num_digits == 0) {
    return;
  }
  uVar1 = number_of_digits_decimal_left_shift(h,shift);
  uVar4 = h->num_digits;
  uVar2 = 0;
  uVar6 = uVar4;
  while( true ) {
    uVar6 = uVar6 - 1;
    uVar5 = uVar1 + uVar6;
    if ((int)uVar6 < 0) break;
    uVar3 = ((ulong)h->digits[uVar6] << ((byte)shift & 0x3f)) + uVar2;
    uVar2 = uVar3 / 10;
    uVar3 = uVar3 % 10;
    if (uVar5 < 0x300) {
      h->digits[uVar5] = (uint8_t)uVar3;
    }
    else if (uVar3 != 0) {
      h->truncated = true;
    }
  }
  while (uVar2 != 0) {
    if (uVar5 < 0x300) {
      h->digits[uVar5] = (uint8_t)(uVar2 % 10);
    }
    else if (uVar2 % 10 != 0) {
      h->truncated = true;
    }
    uVar5 = uVar5 - 1;
    uVar2 = uVar2 / 10;
  }
  uVar4 = uVar4 + uVar1;
  if (0x2ff < uVar4) {
    uVar4 = 0x300;
  }
  h->num_digits = uVar4;
  h->decimal_point = h->decimal_point + uVar1;
  trim(h);
  return;
}

Assistant:

inline void decimal_left_shift(decimal &h, uint32_t shift) {
  if (h.num_digits == 0) {
    return;
  }
  uint32_t num_new_digits = number_of_digits_decimal_left_shift(h, shift);
  int32_t read_index = int32_t(h.num_digits - 1);
  uint32_t write_index = h.num_digits - 1 + num_new_digits;
  uint64_t n = 0;

  while (read_index >= 0) {
    n += uint64_t(h.digits[read_index]) << shift;
    uint64_t quotient = n / 10;
    uint64_t remainder = n - (10 * quotient);
    if (write_index < max_digits) {
      h.digits[write_index] = uint8_t(remainder);
    } else if (remainder > 0) {
      h.truncated = true;
    }
    n = quotient;
    write_index--;
    read_index--;
  }
  while (n > 0) {
    uint64_t quotient = n / 10;
    uint64_t remainder = n - (10 * quotient);
    if (write_index < max_digits) {
      h.digits[write_index] = uint8_t(remainder);
    } else if (remainder > 0) {
      h.truncated = true;
    }
    n = quotient;
    write_index--;
  }
  h.num_digits += num_new_digits;
  if (h.num_digits > max_digits) {
    h.num_digits = max_digits;
  }
  h.decimal_point += int32_t(num_new_digits);
  trim(h);
}